

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O0

int Gia_ManLevelNum(Gia_Man_t *p)

{
  int iVar1;
  int b;
  bool bVar2;
  int local_1c;
  Gia_Obj_t *pGStack_18;
  int i;
  Gia_Obj_t *pObj;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ManObjNum(p);
  Gia_ManCleanLevels(p,iVar1);
  p->nLevels = 0;
  local_1c = 0;
  while( true ) {
    bVar2 = false;
    if (local_1c < p->nObjs) {
      pGStack_18 = Gia_ManObj(p,local_1c);
      bVar2 = pGStack_18 != (Gia_Obj_t *)0x0;
    }
    if (!bVar2) break;
    if ((p->fGiaSimple == 0) && (iVar1 = Gia_ObjIsBuf(pGStack_18), iVar1 != 0)) {
      Gia_ObjSetBufLevel(p,pGStack_18);
    }
    else {
      iVar1 = Gia_ObjIsAnd(pGStack_18);
      if (iVar1 == 0) {
        iVar1 = Gia_ObjIsCo(pGStack_18);
        if (iVar1 == 0) {
          Gia_ObjSetLevel(p,pGStack_18,0);
        }
        else {
          Gia_ObjSetCoLevel(p,pGStack_18);
        }
      }
      else {
        Gia_ObjSetGateLevel(p,pGStack_18);
      }
    }
    iVar1 = p->nLevels;
    b = Gia_ObjLevel(p,pGStack_18);
    iVar1 = Abc_MaxInt(iVar1,b);
    p->nLevels = iVar1;
    local_1c = local_1c + 1;
  }
  return p->nLevels;
}

Assistant:

int Gia_ManLevelNum( Gia_Man_t * p )  
{
    Gia_Obj_t * pObj;
    int i;
    Gia_ManCleanLevels( p, Gia_ManObjNum(p) );
    p->nLevels = 0;
    Gia_ManForEachObj( p, pObj, i )
    {
        if ( !p->fGiaSimple && Gia_ObjIsBuf(pObj) )
            Gia_ObjSetBufLevel( p, pObj );
        else if ( Gia_ObjIsAnd(pObj) )
            Gia_ObjSetGateLevel( p, pObj );
        else if ( Gia_ObjIsCo(pObj) )
            Gia_ObjSetCoLevel( p, pObj );
        else
            Gia_ObjSetLevel( p, pObj, 0 );
        p->nLevels = Abc_MaxInt( p->nLevels, Gia_ObjLevel(p, pObj) );
    }
    return p->nLevels;
}